

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.h
# Opt level: O0

cmCommand * __thiscall
cmCMakeHostSystemInformationCommand::Clone(cmCMakeHostSystemInformationCommand *this)

{
  cmCommand *this_00;
  cmCMakeHostSystemInformationCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmCMakeHostSystemInformationCommand((cmCMakeHostSystemInformationCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    return new cmCMakeHostSystemInformationCommand;
  }